

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AddError(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
           *this,ValueType *keyword,ValueType *error)

{
  MemberIterator MVar1;
  bool bVar2;
  Pointer pVVar3;
  CrtAllocator *pCVar4;
  undefined1 local_40 [8];
  ValueType errors;
  undefined1 local_28 [8];
  MemberIterator member;
  ValueType *error_local;
  ValueType *keyword_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  member.ptr_ = (Pointer)error;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::FindMember<rapidjson::CrtAllocator>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_28,&this->error_)
  ;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
             ((long)&errors.data_ + 8));
  bVar2 = GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::operator==
                    ((GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                     local_28,(GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                               *)&errors.data_.s.str);
  MVar1 = member;
  if (bVar2) {
    pCVar4 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              (&this->error_,keyword,&(MVar1.ptr_)->name,pCVar4);
  }
  else {
    pVVar3 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
             operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)local_28);
    bVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::IsObject(&pVVar3->value);
    if (bVar2) {
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40,kArrayType
                );
      pVVar3 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
               operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)local_28);
      pCVar4 = GetStateAllocator(this);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40,
                 &pVVar3->value,pCVar4);
      pVVar3 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
               operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)local_28);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
                (&pVVar3->value,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_40);
    }
    pVVar3 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
             operator->((GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)local_28);
    MVar1 = member;
    pCVar4 = GetStateAllocator(this);
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
              (&pVVar3->value,&(MVar1.ptr_)->name,pCVar4);
  }
  return;
}

Assistant:

void AddError(ValueType& keyword, ValueType& error) {
        typename ValueType::MemberIterator member = error_.FindMember(keyword);
        if (member == error_.MemberEnd())
            error_.AddMember(keyword, error, GetStateAllocator());
        else {
            if (member->value.IsObject()) {
                ValueType errors(kArrayType);
                errors.PushBack(member->value, GetStateAllocator());
                member->value = errors;
            }
            member->value.PushBack(error, GetStateAllocator());
        }
    }